

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuarticTorsionType.hpp
# Opt level: O0

void __thiscall
OpenMD::QuarticTorsionType::calcForce
          (QuarticTorsionType *this,RealType cosPhi,RealType *V,RealType *dVdcosPhi)

{
  double dVar1;
  double dVar2;
  RealType cosPhi4;
  RealType cosPhi3;
  RealType cosPhi2;
  RealType *dVdcosPhi_local;
  RealType *V_local;
  RealType cosPhi_local;
  QuarticTorsionType *this_local;
  
  dVar1 = cosPhi * cosPhi;
  dVar2 = dVar1 * cosPhi;
  *V = this->k4_ * dVar2 * cosPhi +
       this->k3_ * dVar2 + this->k2_ * dVar1 + this->k1_ * cosPhi + this->k0_;
  *dVdcosPhi = this->k4_ * 4.0 * dVar2 +
               this->k3_ * 3.0 * dVar1 + this->k2_ * 2.0 * cosPhi + this->k1_;
  return;
}

Assistant:

virtual void calcForce(RealType cosPhi, RealType& V, RealType& dVdcosPhi) {
      RealType cosPhi2 = cosPhi * cosPhi;
      RealType cosPhi3 = cosPhi2 * cosPhi;
      RealType cosPhi4 = cosPhi3 * cosPhi;

      V = k0_ + k1_ * cosPhi + k2_ * cosPhi2 + k3_ * cosPhi3 + k4_ * cosPhi4;
      dVdcosPhi =
          k1_ + 2.0 * k2_ * cosPhi + 3.0 * k3_ * cosPhi2 + 4.0 * k4_ * cosPhi3;
    }